

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExporterT.hh
# Opt level: O1

HalfedgeHandle __thiscall
OpenMesh::IO::ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::getHeh
          (ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,FaceHandle _fh
          ,VertexHandle _vh)

{
  BaseHandle BVar1;
  BaseHandle BVar2;
  int iVar3;
  long lVar4;
  
  BVar1.idx_ = *(uint *)(*(long *)&(this->mesh_->super_Mesh).
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                   .super_PolyConnectivity.field_0xf8 +
                        (long)(int)_fh.super_BaseHandle.idx_ * 4);
  if (BVar1.idx_ < 0) {
    return (BaseHandle)(BaseHandle)BVar1.idx_;
  }
  iVar3 = 0;
  BVar2.idx_ = BVar1.idx_;
  do {
    if ((BVar1.idx_ == BVar2.idx_) && (iVar3 != 0)) {
      return (HalfedgeHandle)(BaseHandle)BVar2.idx_;
    }
    lVar4 = (ulong)((uint)BVar2.idx_ >> 1) * 0x20 +
            *(long *)&(this->mesh_->super_Mesh).
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                      .super_PolyConnectivity.field_0xe0;
    if ((BaseHandle)*(int *)((ulong)((BVar2.idx_ & 1U) << 4) + 4 + lVar4) ==
        _vh.super_BaseHandle.idx_) {
      return (HalfedgeHandle)(BaseHandle)BVar2.idx_;
    }
    BVar2.idx_ = *(uint *)(lVar4 + 8 + (ulong)((BVar2.idx_ & 1U) << 4));
    iVar3 = iVar3 + (uint)(BVar2.idx_ == BVar1.idx_);
  } while (-1 < BVar2.idx_);
  return (BaseHandle)(BaseHandle)BVar2.idx_;
}

Assistant:

HalfedgeHandle getHeh(FaceHandle _fh, VertexHandle _vh) const override
  {
    typename Mesh::ConstFaceHalfedgeIter fh_it;
    for(fh_it = mesh_.cfh_iter(_fh); fh_it.is_valid();++fh_it)
    {
      if(mesh_.to_vertex_handle(*fh_it) == _vh)
        return *fh_it;
    }
    return *fh_it;
  }